

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fiordhtml(errcxdef *ec,osfildef *fp,appctxdef *appctx,int resfileno,char *resfilename)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long lVar7;
  undefined4 in_ECX;
  long in_RDX;
  FILE *in_RSI;
  long *in_RDI;
  errcxdef *in_R8;
  long pos;
  ushort res_namsiz;
  ulong res_siz;
  ulong res_ofs;
  ulong i;
  ulong entry_cnt;
  uchar buf [256];
  undefined8 in_stack_fffffffffffffe78;
  long *plVar8;
  errcxdef *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  errcxdef *in_stack_fffffffffffffe90;
  ulong local_138;
  undefined1 local_128 [4];
  undefined1 auStack_124 [4];
  undefined1 auStack_120 [248];
  errcxdef *local_28;
  undefined4 local_1c;
  long local_18;
  FILE *local_10;
  long *local_8;
  
  if (in_RDX != 0) {
    local_28 = in_R8;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    sVar2 = fread(local_128,8,1,in_RSI);
    iVar1 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    if (sVar2 != 1) {
      strlen((char *)local_28);
      pcVar3 = errstr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      *(char **)(*local_8 + 0x18) = pcVar3;
      *(undefined4 *)(*local_8 + 0x68) = 1;
      errsign(in_stack_fffffffffffffe80,iVar1,(char *)0x145a94);
    }
    uVar4 = osrp4(local_128);
    for (local_138 = 0; local_138 < uVar4; local_138 = local_138 + 1) {
      sVar2 = fread(local_128,10,1,local_10);
      iVar1 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      if (sVar2 != 1) {
        plVar8 = local_8;
        strlen((char *)local_28);
        pcVar3 = errstr(local_28,(char *)plVar8,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        *(char **)(*local_8 + 0x18) = pcVar3;
        *(undefined4 *)(*local_8 + 0x68) = 1;
        errsign(in_stack_fffffffffffffe80,iVar1,(char *)0x145b53);
      }
      uVar5 = osrp4(local_128);
      uVar6 = osrp4(auStack_124);
      iVar1 = osrp2(auStack_120);
      sVar2 = fread(local_128,(ulong)(ushort)iVar1,1,local_10);
      if (sVar2 != 1) {
        plVar8 = local_8;
        strlen((char *)local_28);
        iVar1 = (int)((ulong)plVar8 >> 0x20);
        pcVar3 = errstr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int)((ulong)local_28 >> 0x20));
        *(char **)(*local_8 + 0x18) = pcVar3;
        *(undefined4 *)(*local_8 + 0x68) = 1;
        errsign(local_28,iVar1,(char *)0x145c1f);
      }
      if (*(long *)(local_18 + 0x40) != 0) {
        (**(code **)(local_18 + 0x40))
                  (*(undefined8 *)(local_18 + 0x48),uVar5,uVar6,local_128,(ushort)iVar1,local_1c);
      }
    }
    if (*(long *)(local_18 + 0x30) != 0) {
      lVar7 = ftell(local_10);
      (**(code **)(local_18 + 0x30))(*(undefined8 *)(local_18 + 0x38),lVar7,local_1c);
    }
  }
  return;
}

Assistant:

static void fiordhtml(errcxdef *ec, osfildef *fp, appctxdef *appctx,
                      int resfileno, const char *resfilename)
{
    uchar buf[256];

    /* 
     *   resource map - if the host system is interested, tell it about it 
     */
    if (appctx != 0)
    {
        ulong entry_cnt;
        ulong i;
        
        /* read the index table header */
        if (osfrb(fp, buf, 8))
            errsig1(ec, ERR_RDRSC, ERRTSTR,
                    errstr(ec, resfilename, strlen(resfilename)));

        /* get the number of entries in the table */
        entry_cnt = osrp4(buf);
        
        /* read the index entries */
        for (i = 0 ; i < entry_cnt ; ++i)
        {
            ulong res_ofs;
            ulong res_siz;
            ushort res_namsiz;
            
            /* read this entry */
            if (osfrb(fp, buf, 10))
                errsig1(ec, ERR_RDRSC, ERRTSTR,
                        errstr(ec, resfilename, strlen(resfilename)));

            /* get the entry header */
            res_ofs = osrp4(buf);
            res_siz = osrp4(buf + 4);
            res_namsiz = osrp2(buf + 8);
            
            /* read this entry's name */
            if (osfrb(fp, buf, res_namsiz))
                errsig1(ec, ERR_RDRSC, ERRTSTR,
                        errstr(ec, resfilename, strlen(resfilename)));
            
            /* tell the host system about this entry */
            if (appctx->add_resource)
                (*appctx->add_resource)(appctx->add_resource_ctx,
                                        res_ofs, res_siz,
                                        (char *)buf,
                                        (size_t)res_namsiz,
                                        resfileno);
        }
        
        /* tell the host system where the resources start */
        if (appctx->set_resmap_seek != 0)
        {
            long pos = osfpos(fp);
            (*appctx->set_resmap_seek)(appctx->set_resmap_seek_ctx,
                                       pos, resfileno);
        }
    }
}